

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O3

bool anon_unknown.dwarf_8c247::findPoint<double>
               (vector<int,_std::allocator<int>_> *data,vector<int,_std::allocator<int>_> *second,
               vector<double,_std::allocator<double>_> *edge,uint32_t leftSideOffset,
               uint32_t rightSideOffset,int minimumContrast,bool checkContrast,
               uint32_t leftSideContrastCheck,uint32_t rightSideContrastCheck,uint32_t position,
               uint32_t size)

{
  int iVar1;
  iterator __position;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __result;
  int *piVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int *piVar11;
  long lVar12;
  ulong uVar13;
  int *piVar14;
  int *piVar15;
  undefined1 auVar16 [16];
  float fVar17;
  undefined1 auVar18 [16];
  undefined4 in_XMM3_Da;
  undefined4 in_XMM3_Db;
  undefined8 in_XMM3_Qb;
  double local_30;
  
  uVar13 = (ulong)leftSideOffset;
  piVar5 = (int *)((long)&(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start + uVar13 * 4);
  iVar6 = *piVar5;
  iVar10 = iVar6;
  if (leftSideOffset != rightSideOffset &&
      piVar5 != (int *)((long)&(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + (ulong)rightSideOffset * 4 + 4)) {
    piVar11 = (int *)((long)&(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + uVar13 * 4 + 4);
    lVar12 = (ulong)rightSideOffset * 4;
    lVar8 = lVar12 + uVar13 * -4;
    piVar14 = piVar5;
    piVar15 = piVar11;
    do {
      iVar1 = *piVar15;
      iVar9 = iVar10;
      if (iVar10 <= iVar1) {
        iVar9 = iVar1;
      }
      if (iVar10 < iVar1) {
        piVar14 = piVar15;
      }
      piVar15 = piVar15 + 1;
      lVar8 = lVar8 + -4;
      iVar10 = iVar9;
    } while (lVar8 != 0);
    iVar10 = *piVar14;
    lVar12 = lVar12 + uVar13 * -4;
    do {
      if (*piVar11 < iVar6) {
        piVar5 = piVar11;
        iVar6 = *piVar11;
      }
      piVar11 = piVar11 + 1;
      lVar12 = lVar12 + -4;
    } while (lVar12 != 0);
  }
  if (iVar10 - *piVar5 < minimumContrast) {
LAB_0011a961:
    bVar4 = false;
  }
  else {
    if ((checkContrast && leftSideContrastCheck <= position) &&
       (uVar7 = position + rightSideContrastCheck, uVar7 < size)) {
      auVar18 = ZEXT816(0) << 0x40;
      auVar16 = ZEXT816(0) << 0x40;
      if ((long)&(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start + (ulong)(position - leftSideContrastCheck) * 4 !=
          (long)&(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start + (ulong)position * 4 + 4) {
        lVar8 = (ulong)(position - leftSideContrastCheck) << 2;
        fVar17 = 0.0;
        do {
          piVar5 = (int *)((long)&(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start + lVar8);
          lVar8 = lVar8 + 4;
          fVar17 = fVar17 + (float)*piVar5;
        } while ((ulong)position * 4 + 4 != lVar8);
        auVar16._0_8_ = (double)fVar17;
        auVar16._8_8_ = 0;
      }
      uVar13 = (ulong)(position + 1);
      if ((long)&(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start + uVar13 * 4 !=
          (long)&(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start + (ulong)uVar7 * 4 + 4) {
        lVar8 = uVar13 * 4;
        fVar17 = 0.0;
        do {
          piVar5 = (int *)((long)&(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start + lVar8);
          lVar8 = lVar8 + 4;
          fVar17 = fVar17 + (float)*piVar5;
        } while ((ulong)uVar7 * 4 + 4 != lVar8);
        auVar18._0_8_ = (double)fVar17;
        auVar18._8_8_ = 0;
      }
      auVar18 = vmovlhps_avx(auVar18,auVar16);
      auVar16 = vpinsrd_avx(ZEXT416(rightSideContrastCheck),leftSideContrastCheck + 1,1);
      auVar16 = vcvtudq2pd_avx512vl(auVar16);
      auVar18 = vdivpd_avx(auVar18,auVar16);
      auVar18 = vhsubpd_avx(auVar18,auVar18);
      if (auVar18._0_8_ < (double)minimumContrast) goto LAB_0011a961;
    }
    else {
      if (checkContrast) goto LAB_0011a961;
      uVar13 = (ulong)(position + 1);
    }
    iVar6 = *(int *)((long)&(second->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start + (ulong)position * 4);
    iVar10 = iVar6 - *(int *)((long)&(second->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                     .super__Vector_impl_data._M_start + uVar13 * 4);
    if (iVar10 == 0) {
      auVar2._4_4_ = in_XMM3_Db;
      auVar2._0_4_ = in_XMM3_Da;
      auVar2._8_8_ = in_XMM3_Qb;
      auVar18 = vcvtusi2ss_avx512f(auVar2,position);
      local_30 = (double)(auVar18._0_4_ + 0.5);
    }
    else {
      auVar3._4_4_ = in_XMM3_Db;
      auVar3._0_4_ = in_XMM3_Da;
      auVar3._8_8_ = in_XMM3_Qb;
      auVar18 = vcvtusi2sd_avx512f(auVar3,position);
      local_30 = (double)iVar6 / (double)iVar10 + auVar18._0_8_;
    }
    __position._M_current =
         (edge->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
         ._M_finish;
    if (__position._M_current ==
        (edge->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (edge,__position,&local_30);
    }
    else {
      *__position._M_current = local_30;
      (edge->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = __position._M_current + 1;
    }
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool findPoint( const std::vector< int > & data, const std::vector< int > & second, std::vector< _Type > & edge,
                    uint32_t leftSideOffset, uint32_t rightSideOffset, int minimumContrast, bool checkContrast,
                    uint32_t leftSideContrastCheck, uint32_t rightSideContrastCheck, uint32_t position, uint32_t size )
    {
        const int maxIntensity = *(std::max_element( data.begin() + leftSideOffset, data.begin() + rightSideOffset + 1 ));
        const int minIntensity = *(std::min_element( data.begin() + leftSideOffset, data.begin() + rightSideOffset + 1 ));

        if ( maxIntensity - minIntensity < minimumContrast )
            return false;

        if ( checkContrast && leftSideContrastCheck <= position && (rightSideContrastCheck + position) < size ) {
            const uint32_t blackContrastEnd   = position;
            const uint32_t whiteContrastStart = position + 1;

            const uint32_t blackContrastStart = position - leftSideContrastCheck;
            const uint32_t whiteContrastEnd   = position + rightSideContrastCheck;

            _Type sumBlack = std::accumulate( data.begin() + blackContrastStart, data.begin() + blackContrastEnd + 1, 0.0f );
            _Type sumWhite = std::accumulate( data.begin() + whiteContrastStart, data.begin() + whiteContrastEnd + 1, 0.0f );

            sumBlack /= (blackContrastEnd - blackContrastStart + 1);
            sumWhite /= (whiteContrastEnd - whiteContrastStart + 1);

            if ( sumWhite - sumBlack >= minimumContrast )
                checkContrast = false;
        }

        if ( !checkContrast ) {
            if ( second[position] != second[position + 1] )
                edge.push_back( position + static_cast<_Type>(second[position]) / (second[position] - second[position + 1u]) );
            else
                edge.push_back( position + 0.5f );
            return true;
        }

        return false;
    }